

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

ssize_t __thiscall
ritobin::io::impl_binary_read::BinaryReader::read
          (BinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *extraout_RAX;
  uint32_t *puVar3;
  undefined4 in_register_00000034;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  puVar3 = (uint32_t *)this->cur_;
  puVar2 = (uint32_t *)this->cap_;
  puVar1 = puVar3 + 1;
  if (puVar1 <= puVar2) {
    local_40._0_4_ = *puVar3;
    this->cur_ = (char *)puVar1;
    local_38._M_p = (pointer)&local_28;
    local_30 = 0;
    local_28._M_local_buf[0] = '\0';
    FNV1a::operator=((FNV1a *)CONCAT44(in_register_00000034,__fd),(FNV1a *)local_40);
    std::__cxx11::string::~string((string *)&local_38);
    puVar3 = extraout_RAX;
  }
  return CONCAT71((int7)((ulong)puVar3 >> 8),puVar1 <= puVar2);
}

Assistant:

inline bool read(T& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) > cap_) {
                return false;
            }
            memcpy(&value, cur_, sizeof(T));
            cur_ += sizeof(T);
            return true;
        }